

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O0

int CoreWvsnprintf(CPalThread *pthrCurrent,LPWSTR Buffer,size_t Count,LPCWSTR Format,
                  __va_list_tag *aparg)

{
  long lVar1;
  LPCSTR lpMultiByteStr;
  bool bVar2;
  bool bVar3;
  FILE *pFVar4;
  BOOL BVar5;
  int cchWideChar;
  errno_t eVar6;
  DWORD DVar7;
  size_t sVar8;
  int *piVar9;
  long in_FS_OFFSET;
  bool bVar10;
  undefined4 *local_680;
  undefined4 *local_668;
  undefined8 *local_650;
  undefined8 *local_630;
  INT *local_610;
  INT *local_5f8;
  undefined4 *local_5e0;
  undefined8 *local_598;
  undefined8 *local_580;
  INT *local_550;
  INT *local_520;
  undefined1 auStack_508 [8];
  va_list apcopy;
  short s_1;
  int n;
  short trunc2;
  long trunc1;
  size_t TempCount;
  INT Length;
  UINT Length_1;
  LPSTR s;
  BOOL needToFree;
  BOOL precisionSet;
  va_list ap;
  char *pcStack_498;
  int mbtowcResult;
  LPSTR TempNumberBuffer;
  int local_488;
  INT TempInt;
  INT Type;
  INT Prefix;
  INT Precision;
  INT Width;
  INT Flags;
  WCHAR TempWChar [2];
  LPWSTR WorkingWStr;
  LPWSTR TempWStr;
  LPCWSTR Fmt;
  LPWSTR BufferPtr;
  __va_list_tag *p_Stack_448;
  BOOL BufferRanOut;
  __va_list_tag *aparg_local;
  LPCWSTR Format_local;
  size_t Count_local;
  LPWSTR Buffer_local;
  CPalThread *pthrCurrent_local;
  CHAR local_418 [8];
  CHAR TempBuff [1024];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BufferPtr._4_4_ = 0;
  _Flags = (char16_t *)0x0;
  p_Stack_448 = aparg;
  aparg_local = (__va_list_tag *)Format;
  Format_local = (LPCWSTR)Count;
  Count_local = (size_t)Buffer;
  Buffer_local = (LPWSTR)pthrCurrent;
  if (!PAL_InitializeChakraCoreCalled) {
    TempWStr = Format;
    Fmt = Buffer;
    abort();
  }
  ap[0].overflow_arg_area = aparg->reg_save_area;
  needToFree = aparg->gp_offset;
  precisionSet = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  bVar2 = false;
  TempWStr = Format;
  Fmt = Buffer;
  do {
    if (*TempWStr == L'\0') {
LAB_0037926e:
      if ((long)((long)Fmt - Count_local) >> 1 < (long)(int)Format_local) {
        *Fmt = L'\0';
      }
      if (BufferPtr._4_4_ == 0) {
        pthrCurrent_local._4_4_ = (int)((long)((long)Fmt - Count_local) >> 1);
      }
      else {
        piVar9 = __errno_location();
        *piVar9 = 0x22;
        pthrCurrent_local._4_4_ = -1;
      }
LAB_003792dd:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return pthrCurrent_local._4_4_;
    }
    if ((BufferPtr._4_4_ != 0) || ((long)(int)Format_local <= (long)((long)Fmt - Count_local) >> 1))
    {
      BufferPtr._4_4_ = 1;
      goto LAB_0037926e;
    }
    if ((*TempWStr == L'%') &&
       (BVar5 = Internal_ExtractFormatW
                          ((CPalThread *)Buffer_local,&TempWStr,local_418,&Precision,&Prefix,&Type,
                           &TempInt,&local_488), BVar5 == 1)) {
      if (((((TempInt == 2) || (TempInt == 4)) && ((local_488 == 2 || (local_488 == 3)))) ||
          ((TempInt == 1 && (local_488 == 2)))) || ((local_488 == 3 && ((Precision & 4U) != 0)))) {
        bVar3 = false;
        if (Prefix == -2) {
          if ((uint)needToFree < 0x29) {
            local_520 = (INT *)((long)needToFree + (long)ap[0].overflow_arg_area);
            needToFree = needToFree + 8;
          }
          else {
            local_520 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Prefix = *local_520;
        }
        else if (Prefix == -3) {
          if ((uint)needToFree < 0x29) {
            needToFree = needToFree + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if (Type == -2) {
          if ((uint)needToFree < 0x29) {
            local_550 = (INT *)((long)needToFree + (long)ap[0].overflow_arg_area);
            needToFree = needToFree + 8;
          }
          else {
            local_550 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Type = *local_550;
          bVar2 = true;
        }
        else if (Type == -4) {
          if ((uint)needToFree < 0x29) {
            needToFree = needToFree + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if (((local_488 == 2) && (TempInt == 2)) || (TempInt == 4)) {
          if ((uint)needToFree < 0x29) {
            local_580 = (undefined8 *)((long)needToFree + (long)ap[0].overflow_arg_area);
            needToFree = needToFree + 8;
          }
          else {
            local_580 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          WorkingWStr = (LPWSTR)*local_580;
        }
        else {
          if ((uint)needToFree < 0x29) {
            local_598 = (undefined8 *)((long)needToFree + (long)ap[0].overflow_arg_area);
            needToFree = needToFree + 8;
          }
          else {
            local_598 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          lpMultiByteStr = (LPCSTR)*local_598;
          cchWideChar = MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)0x0,0);
          if (cchWideChar == 0) {
            fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                    ,0x7ae);
            fprintf(_stderr,"Unable to convert from multibyte  to wide char.\n");
            pthrCurrent_local._4_4_ = -1;
            goto LAB_003792dd;
          }
          WorkingWStr = (LPWSTR)CorUnix::InternalMalloc((ulong)(cchWideChar + 1) << 1);
          if (WorkingWStr == (LPWSTR)0x0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pthrCurrent_local._4_4_ = -1;
            goto LAB_003792dd;
          }
          bVar3 = true;
          MultiByteToWideChar(0,0,lpMultiByteStr,-1,WorkingWStr,cchWideChar);
        }
        TempCount._0_4_ = 0;
        if (bVar2) {
          while( true ) {
            bVar10 = false;
            if ((int)TempCount <= Type) {
              bVar10 = WorkingWStr[(int)TempCount] != L'\0';
            }
            if (!bVar10) break;
            TempCount._0_4_ = (int)TempCount + 1;
          }
        }
        else {
          sVar8 = PAL_wcslen(WorkingWStr);
          TempCount._0_4_ = (int)sVar8;
        }
        _Flags = (char16_t *)CorUnix::InternalMalloc((long)((int)TempCount + 1) << 1);
        if (_Flags == (char16_t *)0x0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CorUnix::CPalThread::SetLastError(8);
          if (bVar3) {
            CorUnix::InternalFree(WorkingWStr);
          }
          pthrCurrent_local._4_4_ = -1;
          goto LAB_003792dd;
        }
        if (Type == -3) {
          *_Flags = L'\0';
          TempCount._0_4_ = 0;
        }
        else if ((Type < 1) || ((int)TempCount <= Type)) {
          PAL_wcscpy(_Flags,WorkingWStr);
        }
        else {
          eVar6 = wcsncpy_s((char16_t_conflict *)_Flags,(long)((int)TempCount + 1),
                            (char16_t_conflict *)WorkingWStr,(long)Type);
          if (eVar6 != 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            if (bVar3) {
              CorUnix::InternalFree(WorkingWStr);
            }
            CorUnix::InternalFree(_Flags);
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pthrCurrent_local._4_4_ = -1;
            goto LAB_003792dd;
          }
          TempCount._0_4_ = Type;
        }
        BVar5 = Internal_AddPaddingW
                          (&Fmt,(int)Format_local - (int)((long)((long)Fmt - Count_local) >> 1),
                           _Flags,Prefix - (int)TempCount,Precision);
        BufferPtr._4_4_ = (uint)((BVar5 != 0 ^ 0xffU) & 1);
        if (bVar3) {
          CorUnix::InternalFree(WorkingWStr);
        }
        CorUnix::InternalFree(_Flags);
      }
      else if ((TempInt == 2) && (local_488 == 1)) {
        if ((Prefix == -2) || (Prefix == -3)) {
          if ((uint)needToFree < 0x29) {
            needToFree = needToFree + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((Type == -2) || (Type == -4)) {
          if ((uint)needToFree < 0x29) {
            needToFree = needToFree + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((uint)needToFree < 0x29) {
          local_5e0 = (undefined4 *)((long)needToFree + (long)ap[0].overflow_arg_area);
          needToFree = needToFree + 8;
        }
        else {
          local_5e0 = (undefined4 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Width._0_2_ = (undefined2)*local_5e0;
        Width._2_2_ = 0;
        BVar5 = Internal_AddPaddingW
                          (&Fmt,(int)Format_local - (int)((long)((long)Fmt - Count_local) >> 1),
                           (LPWSTR)&Width,Prefix + -1,Precision);
        BufferPtr._4_4_ = (uint)((BVar5 != 0 ^ 0xffU) & 1);
      }
      else if (local_488 == 6) {
        if (Prefix == -2) {
          if ((uint)needToFree < 0x29) {
            local_5f8 = (INT *)((long)needToFree + (long)ap[0].overflow_arg_area);
            needToFree = needToFree + 8;
          }
          else {
            local_5f8 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Prefix = *local_5f8;
        }
        if (Type == -2) {
          if ((uint)needToFree < 0x29) {
            local_610 = (INT *)((long)needToFree + (long)ap[0].overflow_arg_area);
            needToFree = needToFree + 8;
          }
          else {
            local_610 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Type = *local_610;
        }
        if (TempInt == 1) {
          if ((uint)needToFree < 0x29) {
            local_630 = (undefined8 *)((long)needToFree + (long)ap[0].overflow_arg_area);
            needToFree = needToFree + 8;
          }
          else {
            local_630 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*local_630 = (short)((long)((long)Fmt - Count_local) >> 1);
        }
        else {
          if ((uint)needToFree < 0x29) {
            local_650 = (undefined8 *)((long)needToFree + (long)ap[0].overflow_arg_area);
            needToFree = needToFree + 8;
          }
          else {
            local_650 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*local_650 = (int)((long)((long)Fmt - Count_local) >> 1);
        }
      }
      else {
        trunc1 = (long)Format_local - ((long)((long)Fmt - Count_local) >> 1);
        if (0x40000000 < (ulong)trunc1) {
          trunc1 = 0x40000000;
        }
        if ((local_488 == 5) && (TempInt == 1)) {
          if ((uint)needToFree < 0x29) {
            local_668 = (undefined4 *)((long)needToFree + (long)ap[0].overflow_arg_area);
            needToFree = needToFree + 8;
          }
          else {
            local_668 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          TempNumberBuffer._4_4_ = snprintf((char *)Fmt,trunc1,local_418,(long)(short)*local_668);
        }
        else if ((local_488 == 4) && (TempInt == 1)) {
          if ((uint)needToFree < 0x29) {
            local_680 = (undefined4 *)((long)needToFree + (long)ap[0].overflow_arg_area);
            needToFree = needToFree + 8;
          }
          else {
            local_680 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          apcopy[0].reg_save_area._6_2_ = (short)*local_680;
          TempNumberBuffer._4_4_ =
               snprintf((char *)Fmt,trunc1,local_418,(ulong)(uint)(int)apcopy[0].reg_save_area._6_2_
                       );
        }
        else {
          apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
          auStack_508._0_4_ = needToFree;
          auStack_508._4_4_ = precisionSet;
          apcopy[0].gp_offset = ap[0].gp_offset;
          apcopy[0].fp_offset = ap[0].fp_offset;
          TempNumberBuffer._4_4_ = vsnprintf((char *)Fmt,trunc1,local_418,auStack_508);
          PAL_printf_arg_remover((va_list *)&needToFree,Prefix,Type,local_488,TempInt);
        }
        if (TempNumberBuffer._4_4_ != 0) {
          if ((TempNumberBuffer._4_4_ < 0) || ((ulong)trunc1 <= (ulong)(long)TempNumberBuffer._4_4_)
             ) {
            pcStack_498 = (char *)CorUnix::InternalMalloc(trunc1 + 1);
            if (pcStack_498 == (char *)0x0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              CorUnix::CPalThread::SetLastError(8);
              piVar9 = __errno_location();
              *piVar9 = 0xc;
              pthrCurrent_local._4_4_ = -1;
              goto LAB_003792dd;
            }
            eVar6 = strncpy_s(pcStack_498,trunc1 + 1,(char *)Fmt,trunc1);
            if (eVar6 != 0) {
              fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                      ,0x870);
              fprintf(_stderr,"strncpy_s failed!\n");
              CorUnix::InternalFree(pcStack_498);
              pthrCurrent_local._4_4_ = -1;
              goto LAB_003792dd;
            }
            ap[0].reg_save_area._4_4_ =
                 MultiByteToWideChar(0,0,pcStack_498,(int)trunc1,Fmt,(int)trunc1);
            if (ap[0].reg_save_area._4_4_ == 0) {
              fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                      ,0x87d);
              pFVar4 = _stderr;
              DVar7 = GetLastError();
              fprintf(pFVar4,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar7);
              CorUnix::InternalFree(pcStack_498);
              pthrCurrent_local._4_4_ = -1;
              goto LAB_003792dd;
            }
            Fmt = Fmt + trunc1;
            BufferPtr._4_4_ = 1;
          }
          else {
            pcStack_498 = (char *)CorUnix::InternalMalloc((long)(TempNumberBuffer._4_4_ + 1));
            if (pcStack_498 == (char *)0x0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              CorUnix::CPalThread::SetLastError(8);
              pthrCurrent_local._4_4_ = -1;
              goto LAB_003792dd;
            }
            eVar6 = strncpy_s(pcStack_498,(long)(TempNumberBuffer._4_4_ + 1),(char *)Fmt,
                              (long)TempNumberBuffer._4_4_);
            if (eVar6 != 0) {
              fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                      ,0x892);
              fprintf(_stderr,"strncpy_s failed!\n");
              CorUnix::InternalFree(pcStack_498);
              pthrCurrent_local._4_4_ = -1;
              goto LAB_003792dd;
            }
            ap[0].reg_save_area._4_4_ =
                 MultiByteToWideChar(0,0,pcStack_498,TempNumberBuffer._4_4_,Fmt,
                                     TempNumberBuffer._4_4_);
            if (ap[0].reg_save_area._4_4_ == 0) {
              fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                      ,0x89f);
              pFVar4 = _stderr;
              DVar7 = GetLastError();
              fprintf(pFVar4,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar7);
              CorUnix::InternalFree(pcStack_498);
              pthrCurrent_local._4_4_ = -1;
              goto LAB_003792dd;
            }
            Fmt = Fmt + TempNumberBuffer._4_4_;
          }
          CorUnix::InternalFree(pcStack_498);
        }
      }
    }
    else {
      *Fmt = *TempWStr;
      TempWStr = TempWStr + 1;
      Fmt = Fmt + 1;
    }
  } while( true );
}

Assistant:

int CoreWvsnprintf(CPalThread *pthrCurrent, LPWSTR Buffer, size_t Count, LPCWSTR Format, va_list aparg)
{
    BOOL BufferRanOut = FALSE;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPWSTR BufferPtr = Buffer;
    LPCWSTR Fmt = Format;
    LPWSTR TempWStr = NULL;
    LPWSTR WorkingWStr = NULL;
    WCHAR TempWChar[2];
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT TempInt;
    LPSTR TempNumberBuffer;
    int mbtowcResult;
    va_list(ap);

    PERF_ENTRY(wvsnprintf);
    ENTRY("wvsnprintf (buffer=%p, count=%u, format=%p (%S))\n",
          Buffer, Count, Format, Format);

    va_copy(ap, aparg);
    BOOL precisionSet = false;

    while (*Fmt)
    {
        if (BufferRanOut || (BufferPtr - Buffer) >= static_cast<int>(Count)) //Count is assumed to be in the range of int
        {
            BufferRanOut = TRUE;
            break;
        }
        else if(*Fmt == '%' &&
                TRUE == Internal_ExtractFormatW(pthrCurrent, &Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (((Prefix == PFF_PREFIX_LONG || Prefix == PFF_PREFIX_LONG_W) &&
                (Type == PFF_TYPE_STRING || Type == PFF_TYPE_WSTRING)) ||
                (Prefix == PFF_PREFIX_SHORT && Type == PFF_TYPE_STRING) ||
                (Type == PFF_TYPE_WSTRING && (Flags & PFF_ZERO) != 0))
            {
                BOOL needToFree = FALSE;

                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                    precisionSet = true;
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if ((Type == PFF_TYPE_STRING && Prefix == PFF_PREFIX_LONG) ||
                    Prefix == PFF_PREFIX_LONG_W)
                {
                    TempWStr = va_arg(ap, LPWSTR);
                }
                else
                {
                    // %lS and %hs assume an LPSTR argument.
                    LPSTR s = va_arg(ap, LPSTR );
                    UINT Length = 0;
                    Length = MultiByteToWideChar( CP_ACP, 0, s, -1, NULL, 0 );
                    if ( Length != 0 )
                    {
                        TempWStr =
                            (LPWSTR)InternalMalloc((Length + 1 ) * sizeof( WCHAR ) );
                        if ( TempWStr )
                        {
                            needToFree = TRUE;
                            MultiByteToWideChar( CP_ACP, 0, s, -1,
                                                 TempWStr, Length );
                        }
                        else
                        {
                            ERROR( "InternalMalloc failed.\n" );
                            va_end(ap);
                            return -1;
                        }
                    }
                    else
                    {
                        ASSERT( "Unable to convert from multibyte "
                               " to wide char.\n" );
                        va_end(ap);
                        return -1;
                    }
                }

                INT Length = 0;
                if (precisionSet)
                {
                    for(; Length <= Precision && TempWStr[Length] != 0; Length++);
                }
                else
                {
                    Length = PAL_wcslen(TempWStr);
                }

                WorkingWStr = (LPWSTR) InternalMalloc(sizeof(WCHAR) * (Length + 1));
                if (!WorkingWStr)
                {
                    ERROR("InternalMalloc failed\n");
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if (needToFree)
                    {
                        InternalFree(TempWStr);
                    }
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    // Copy nothing
                    *WorkingWStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length)
                {
                    if (wcsncpy_s(WorkingWStr, (Length + 1), TempWStr, Precision) != SAFECRT_SUCCESS)
                    {
                        ERROR("CoreWvsnprintf failed\n");
                        if (needToFree)
                        {
                            InternalFree(TempWStr);
                        }
                        InternalFree(WorkingWStr);
                        LOGEXIT("wcsncpy_s failed!\n");
                        PERF_EXIT(wvsnprintf);
                        va_end(ap);
                        return (-1);
                    }
                    Length = Precision;
                }
                else
                {
                    // Copy everything
                    PAL_wcscpy(WorkingWStr, TempWStr);
                }

                // Add padding if needed.
                BufferRanOut = !Internal_AddPaddingW(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   WorkingWStr,
                                                   Width - Length,
                                                   Flags);

                if (needToFree)
                {
                    InternalFree(TempWStr);
                }
                InternalFree(WorkingWStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar[0] = va_arg(ap, int);
                TempWChar[1] = 0;

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingW(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempWChar,
                                                   Width - 1,
                                                   Flags);

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = BufferPtr - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = BufferPtr - Buffer;
                }
            }
            else
            {
                // Types that sprintf can handle

                /* note: I'm using the wide buffer as a (char *) buffer when I
                   pass it to sprintf().  After I get the buffer back I make a
                   backup of the chars copied and then convert them to wide
                   and place them in the buffer (BufferPtr) */
                size_t TempCount = Count - (BufferPtr - Buffer);
                TempInt = 0;

#if !HAVE_LARGE_SNPRINTF_SUPPORT
                // Limit TempCount to 0x40000000, which is sufficient
                // for platforms on which snprintf fails for very large
                // sizes.
                if (TempCount > 0x40000000)
                {
                    TempCount = 0x40000000;
                }
#endif  // HAVE_LARGE_SNPRINTF_SUPPORT

                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = snprintf((LPSTR)BufferPtr, TempCount, TempBuff, trunc1);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf((LPSTR)BufferPtr, TempCount, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = vsnprintf((LPSTR) BufferPtr, TempCount, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (TempInt == 0)
                {
                    // The argument is "".
                    continue;
                }
                if (TempInt < 0 || static_cast<size_t>(TempInt) >= TempCount) /* buffer not long enough */
                {
                    TempNumberBuffer = (LPSTR) InternalMalloc(TempCount+1);
                    if (!TempNumberBuffer)
                    {
                        ERROR("InternalMalloc failed\n");
                        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                        errno = ENOMEM;
                        va_end(ap);
                        return -1;
                    }

                    if (strncpy_s(TempNumberBuffer, TempCount+1, (LPSTR) BufferPtr, TempCount) != SAFECRT_SUCCESS)
                    {
                        ASSERT("strncpy_s failed!\n");
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }

                    mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                       TempNumberBuffer,
                                                       TempCount,
                                                       BufferPtr, TempCount);
                    if (!mbtowcResult)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }
                    BufferPtr += TempCount;
                    BufferRanOut = TRUE;
                }
                else
                {
                    TempNumberBuffer = (LPSTR) InternalMalloc(TempInt+1);
                    if (!TempNumberBuffer)
                    {
                        ERROR("InternalMalloc failed\n");
                        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                        va_end(ap);
                        return -1;
                    }

                    if (strncpy_s(TempNumberBuffer, TempInt+1, (LPSTR) BufferPtr, TempInt) != SAFECRT_SUCCESS)
                    {
                        ASSERT("strncpy_s failed!\n");
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }

                    mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                       TempNumberBuffer,
                                                       TempInt,
                                                       BufferPtr, TempInt);
                    if (!mbtowcResult)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }
                    BufferPtr += TempInt;
                }
                InternalFree(TempNumberBuffer);
            }
        }
        else
        {
            *BufferPtr++ = *Fmt++; /* copy regular chars into buffer */
        }
    }

    if (static_cast<int>(Count) > (BufferPtr - Buffer)) //Count is assumed to be in the range of int
    {
        *BufferPtr = 0; /* end the string */
    }

    va_end(ap);

    if (BufferRanOut)
    {
        errno = ERANGE;
        return -1;
    }
    else
    {
        return BufferPtr - Buffer;
    }
}